

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  bool bVar1;
  ulong uVar2;
  SectionNode *pSVar3;
  _anonymous_namespace_ *this_00;
  allocator<char> local_321;
  string local_320;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_300;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *__range1;
  StringRef local_2c0;
  allocator<char> local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [16];
  string local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_258;
  allocator<char> local_241;
  string local_240 [32];
  undefined1 local_220 [16];
  StringRef local_210;
  StringRef local_200;
  allocator<char> local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [32];
  StringRef local_1a8;
  string local_198;
  StringRef local_178;
  StringRef local_168;
  StringRef local_158;
  StringRef local_148;
  StringRef local_138;
  StringRef local_128;
  StringRef local_118;
  StringRef local_108;
  StringRef local_f8;
  StringRef local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string name;
  bool testOkToFail_local;
  SectionNode *sectionNode_local;
  string *rootName_local;
  string *className_local;
  JunitReporter *this_local;
  
  name.field_2._M_local_buf[0xf] = testOkToFail;
  trim((string *)local_50,(string *)sectionNode);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_90,rootName,'/');
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar1 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  if (((bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"testcase",&local_d1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)&this->xml,(XmlFormatting)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_128 = operator____sr("classname",9);
      StringRef::StringRef(&local_138,className);
      XmlWriter::writeAttribute(&this->xml,local_128,local_138);
      local_148 = operator____sr("name",4);
      StringRef::StringRef(&local_158,(string *)local_50);
      XmlWriter::writeAttribute(&this->xml,local_148,local_158);
    }
    else {
      local_e8 = operator____sr("classname",9);
      StringRef::StringRef(&local_f8,(string *)local_50);
      XmlWriter::writeAttribute(&this->xml,local_e8,local_f8);
      local_108 = operator____sr("name",4);
      local_118 = operator____sr("root",4);
      XmlWriter::writeAttribute(&this->xml,local_108,local_118);
    }
    this_00 = (_anonymous_namespace_ *)0x4;
    local_168 = operator____sr("time",4);
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_198,this_00,(sectionNode->stats).durationInSeconds);
    StringRef::StringRef(&local_178,&local_198);
    XmlWriter::writeAttribute(&this->xml,local_168,local_178);
    std::__cxx11::string::~string((string *)&local_198);
    local_1a8 = operator____sr("status",6);
    local_1c8._16_16_ = (undefined1  [16])operator____sr("run",3);
    XmlWriter::writeAttribute(&this->xml,local_1a8,(StringRef)local_1c8._16_16_);
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1e8,"skipped",&local_1e9);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_1c8,(string *)&this->xml,(XmlFormatting)local_1e8)
      ;
      StringRef::StringRef(&local_200,"message");
      StringRef::StringRef(&local_210,"TEST_CASE tagged with !mayfail");
      XmlWriter::ScopedElement::writeAttribute((ScopedElement *)local_1c8,local_200,local_210);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    writeAssertions(this,sectionNode);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_240,"system-out",&local_241);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_220,(string *)&this->xml,(XmlFormatting)local_240)
      ;
      trim((string *)(local_288 + 0x10),&sectionNode->stdOut);
      StringRef::StringRef((StringRef *)&local_258,(string *)(local_288 + 0x10));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_220,(StringRef)local_258,Newline);
      std::__cxx11::string::~string((string *)(local_288 + 0x10));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_220);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2a8,"system-err",&local_2a9);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_288,(string *)&this->xml,(XmlFormatting)local_2a8)
      ;
      trim((string *)&__range1,&sectionNode->stdErr);
      StringRef::StringRef(&local_2c0,(string *)&__range1);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_288,local_2c0,Newline);
      std::__cxx11::string::~string((string *)&__range1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_288);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
  }
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ::begin(&sectionNode->childSections);
  childNode = (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
              std::
              vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::end(&sectionNode->childSections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                                     *)&childNode), bVar1) {
    local_300 = __gnu_cxx::
                __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pSVar3 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(local_300);
      writeSection(this,className,(string *)local_50,pSVar3,
                   (bool)(name.field_2._M_local_buf[0xf] & 1));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
      pSVar3 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(local_300);
      writeSection(this,(string *)local_50,&local_320,pSVar3,
                   (bool)(name.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( sectionNode.hasAnyAssertions()
           || !sectionNode.stdOut.empty()
           || !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname"_sr, name );
                xml.writeAttribute( "name"_sr, "root"_sr );
            }
            else {
                xml.writeAttribute( "classname"_sr, className );
                xml.writeAttribute( "name"_sr, name );
            }
            xml.writeAttribute( "time"_sr, formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status"_sr, "run"_sr );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );


            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }